

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalCSE.cpp
# Opt level: O3

void __thiscall wasm::LocalCSE::doWalkFunction(LocalCSE *this,Function *func)

{
  Expression **currp;
  size_t *psVar1;
  size_t *psVar2;
  Module *pMVar3;
  _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>,_false>_>_>
  *p_Var4;
  _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::(anonymous_namespace)::HashedExpression,_wasm::SmallVector<wasm::Expression_*,_1UL>_>,_true>_>_>
  *p_Var5;
  undefined8 uVar6;
  _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>,_false>_>_>
  *this_00;
  _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::(anonymous_namespace)::HashedExpression,_wasm::SmallVector<wasm::Expression_*,_1UL>_>,_true>_>_>
  *this_01;
  __buckets_ptr pp_Var7;
  size_type sVar8;
  long lVar9;
  size_t *__s;
  undefined8 *puVar10;
  char *pcVar11;
  TaskFunc p_Var12;
  Expression **ppEVar13;
  TaskFunc p_Var14;
  undefined8 *puVar15;
  __node_ptr __n;
  __node_ptr __n_00;
  PassOptions *pPVar16;
  undefined8 *puVar17;
  undefined1 *puStack_510;
  undefined1 auStack_508 [8];
  Scanner scanner;
  Checker checker;
  Applier applier;
  size_t *local_88;
  RequestInfoMap requestInfos;
  new_allocator<std::__detail::_Hash_node_base_*> local_31 [8];
  __buckets_alloc_type __alloc;
  
  pPVar16 = &((this->
              super_WalkerPass<wasm::PostWalker<wasm::LocalCSE,_wasm::Visitor<wasm::LocalCSE,_void>_>_>
              ).super_Pass.runner)->options;
  local_88 = &requestInfos.
              super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
              ._M_h._M_rehash_policy._M_next_resize;
  requestInfos.
  super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
  ._M_h._M_buckets = (__buckets_ptr)0x1;
  requestInfos.
  super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
  ._M_h._M_bucket_count = 0;
  requestInfos.
  super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
  ._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  requestInfos.
  super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
  ._M_h._M_element_count._0_4_ = 0x3f800000;
  requestInfos.
  super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
  ._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  requestInfos.
  super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
  ._M_h._M_rehash_policy._4_4_ = 0;
  requestInfos.
  super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
  ._M_h._M_rehash_policy._M_next_resize = 0;
  psVar1 = &scanner.activeExprs._M_h._M_rehash_policy._M_next_resize;
  auStack_508 = (undefined1  [8])0x0;
  scanner.
  super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .
  super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .replacep = (Expression **)0x0;
  scanner.
  super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .
  super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .stack.fixed._M_elems[9].currp = (Expression **)0x0;
  scanner.
  super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .
  super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .stack.flexible.
  super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  scanner.
  super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .
  super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .stack.flexible.
  super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  scanner.
  super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .
  super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .currModule._0_1_ = 0;
  scanner.activeExprs._M_h._M_buckets = (__buckets_ptr)0x1;
  scanner.activeExprs._M_h._M_bucket_count = 0;
  scanner.activeExprs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  scanner.activeExprs._M_h._M_element_count._0_4_ = 0x3f800000;
  scanner.activeExprs._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  scanner.activeExprs._M_h._M_rehash_policy._4_4_ = 0;
  scanner.activeExprs._M_h._M_rehash_policy._M_next_resize = 0;
  scanner.activeExprs._M_h._M_single_bucket = (__node_base_ptr)0x0;
  lVar9 = 0x138;
  do {
    *(undefined8 *)((long)&puStack_510 + lVar9) = 0;
    *(undefined1 *)
     ((long)(&scanner.
              super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
              .
              super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
              .
              super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
              .stack.fixed + -1) + 0x88 + lVar9) = 0;
    lVar9 = lVar9 + 0x10;
  } while (lVar9 != 0x1d8);
  scanner.activeIncrementalInfo.fixed._M_elems[9].second = false;
  scanner.activeIncrementalInfo.fixed._M_elems[9]._9_7_ = 0;
  scanner.activeIncrementalInfo.flexible.
  super__Vector_base<std::pair<unsigned_long,_bool>,_std::allocator<std::pair<unsigned_long,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  scanner.activeIncrementalInfo.flexible.
  super__Vector_base<std::pair<unsigned_long,_bool>,_std::allocator<std::pair<unsigned_long,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  scanner.activeIncrementalInfo.flexible.
  super__Vector_base<std::pair<unsigned_long,_bool>,_std::allocator<std::pair<unsigned_long,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 1;
  pMVar3 = (this->
           super_WalkerPass<wasm::PostWalker<wasm::LocalCSE,_wasm::Visitor<wasm::LocalCSE,_void>_>_>
           ).super_PostWalker<wasm::LocalCSE,_wasm::Visitor<wasm::LocalCSE,_void>_>.
           super_Walker<wasm::LocalCSE,_wasm::Visitor<wasm::LocalCSE,_void>_>.currModule;
  scanner.
  super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .
  super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .currFunction._0_1_ = SUB81(pMVar3,0);
  scanner.
  super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .
  super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .currFunction._1_7_ = (undefined7)((ulong)pMVar3 >> 8);
  scanner.
  super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .
  super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .stack.flexible.
  super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = SUB81(func,0);
  scanner.
  super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .
  super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .stack.flexible.
  super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = (undefined7)((ulong)func >> 8);
  currp = &func->body;
  puStack_510 = (undefined1 *)0x9353fa;
  scanner.
  super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  ._216_8_ = pPVar16;
  scanner.options = (PassOptions *)&local_88;
  scanner.requestInfos = (RequestInfoMap *)psVar1;
  requestInfos.
  super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
  ._M_h._M_single_bucket = (__node_base_ptr)func;
  Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  ::pushTask((Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
              *)auStack_508,
             LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
             ::scan,currp);
  __n = (__node_ptr)
        (((long)scanner.
                super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .stack.flexible.
                super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>::Task>_>
                ._M_impl.super__Vector_impl_data._M_start -
          (long)scanner.
                super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                .stack.fixed._M_elems[9].currp >> 4) +
        (long)scanner.
              super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
              .
              super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
              .
              super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
              .replacep);
  if (__n != (__node_ptr)0x0) {
    do {
      if ((pointer)scanner.
                   super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                   .
                   super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                   .
                   super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                   .stack.fixed._M_elems[9].currp ==
          scanner.
          super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
          .
          super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
          .
          super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
          .stack.flexible.
          super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>::Task>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        if (scanner.
            super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
            .
            super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
            .
            super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
            .replacep == (Expression **)0x0) {
          pcVar11 = 
          "T &wasm::SmallVector<wasm::Walker<wasm::(anonymous namespace)::Scanner, wasm::UnifiedExpressionVisitor<wasm::(anonymous namespace)::Scanner>>::Task, 10>::back() [T = wasm::Walker<wasm::(anonymous namespace)::Scanner, wasm::UnifiedExpressionVisitor<wasm::(anonymous namespace)::Scanner>>::Task, N = 10]"
          ;
          goto LAB_00935aef;
        }
        p_Var12 = *(TaskFunc *)
                   ((long)(&scanner.
                            super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                            .
                            super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                            .
                            super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                            .stack.fixed + -1) + 0x88 +
                   (long)scanner.
                         super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                         .
                         super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                         .
                         super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                         .replacep * 0x10);
        auStack_508 = *(undefined1 (*) [8])
                       ((long)(&scanner.
                                super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                                .
                                super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                                .
                                super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                                .stack.fixed + -1) + 0x90 +
                       (long)scanner.
                             super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                             .
                             super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                             .
                             super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                             .replacep * 0x10);
        scanner.
        super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
        .
        super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
        .
        super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
        .replacep = (Expression **)
                    ((long)scanner.
                           super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                           .
                           super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                           .
                           super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                           .replacep + -1);
      }
      else {
        p_Var12 = scanner.
                  super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                  .
                  super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                  .
                  super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                  .stack.flexible.
                  super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>::Task>_>
                  ._M_impl.super__Vector_impl_data._M_start[-1].func;
        auStack_508 = (undefined1  [8])
                      scanner.
                      super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                      .
                      super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                      .
                      super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                      .stack.flexible.
                      super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>::Task>_>
                      ._M_impl.super__Vector_impl_data._M_start[-1].currp;
        scanner.
        super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
        .
        super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
        .
        super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
        .stack.flexible.
        super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>::Task>_>
        ._M_impl.super__Vector_impl_data._M_start =
             scanner.
             super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
             .
             super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
             .
             super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
             .stack.flexible.
             super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>::Task>_>
             ._M_impl.super__Vector_impl_data._M_start + -1;
      }
      if (*(Expression **)auStack_508 == (Expression *)0x0) {
        pcVar11 = 
        "void wasm::Walker<wasm::(anonymous namespace)::Scanner, wasm::UnifiedExpressionVisitor<wasm::(anonymous namespace)::Scanner>>::walk(Expression *&) [SubType = wasm::(anonymous namespace)::Scanner, VisitorType = wasm::UnifiedExpressionVisitor<wasm::(anonymous namespace)::Scanner>]"
        ;
        goto LAB_00935aa2;
      }
      puStack_510 = (undefined1 *)0x935483;
      (*p_Var12)((Scanner *)auStack_508,(Expression **)auStack_508);
      __n = (__node_ptr)
            (((long)scanner.
                    super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                    .
                    super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                    .
                    super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                    .stack.flexible.
                    super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>::Task>_>
                    ._M_impl.super__Vector_impl_data._M_start -
              (long)scanner.
                    super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                    .
                    super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                    .
                    super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                    .stack.fixed._M_elems[9].currp >> 4) +
            (long)scanner.
                  super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                  .
                  super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                  .
                  super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                  .replacep);
    } while (__n != (__node_ptr)0x0);
  }
  scanner.
  super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .
  super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .stack.flexible.
  super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  scanner.
  super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .
  super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .stack.flexible.
  super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
  scanner.
  super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .
  super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .currFunction._0_1_ = 0;
  scanner.
  super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .
  super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
  .currFunction._1_7_ = 0;
  if (requestInfos.
      super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
      ._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
    psVar2 = &checker.activeOriginals._M_h._M_rehash_policy._M_next_resize;
    scanner.connectAdjacentBlocks = false;
    scanner._489_7_ = 0;
    checker.
    super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .
    super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .replacep = (Expression **)0x0;
    checker.
    super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .
    super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .stack.fixed._M_elems[9].currp = (Expression **)0x0;
    checker.
    super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .
    super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .stack.flexible.
    super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    checker.
    super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .
    super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .stack.flexible.
    super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    checker.
    super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .
    super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .currModule._0_1_ = 0;
    checker.activeOriginals._M_h._M_buckets = (__buckets_ptr)0x1;
    checker.activeOriginals._M_h._M_bucket_count = 0;
    checker.activeOriginals._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    checker.activeOriginals._M_h._M_element_count._0_4_ = 0x3f800000;
    checker.activeOriginals._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    checker.activeOriginals._M_h._M_rehash_policy._4_4_ = 0;
    checker.activeOriginals._M_h._M_rehash_policy._M_next_resize = 0;
    checker.activeOriginals._M_h._M_single_bucket._0_1_ = 1;
    pMVar3 = (this->
             super_WalkerPass<wasm::PostWalker<wasm::LocalCSE,_wasm::Visitor<wasm::LocalCSE,_void>_>_>
             ).super_PostWalker<wasm::LocalCSE,_wasm::Visitor<wasm::LocalCSE,_void>_>.
             super_Walker<wasm::LocalCSE,_wasm::Visitor<wasm::LocalCSE,_void>_>.currModule;
    checker.
    super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .
    super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .currFunction._0_1_ = SUB81(pMVar3,0);
    checker.
    super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .
    super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .currFunction._1_7_ = (undefined7)((ulong)pMVar3 >> 8);
    checker.
    super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .
    super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .stack.flexible.
    super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ =
         SUB81(requestInfos.
               super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
               ._M_h._M_single_bucket,0);
    checker.
    super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .
    super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .stack.flexible.
    super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ =
         (undefined7)
         ((ulong)requestInfos.
                 super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
                 ._M_h._M_single_bucket >> 8);
    puStack_510 = (undefined1 *)0x935536;
    checker.
    super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    ._216_8_ = pPVar16;
    checker.options = (PassOptions *)&local_88;
    checker.requestInfos = (RequestInfoMap *)psVar2;
    Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    ::pushTask((Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                *)&scanner.connectAdjacentBlocks,
               LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
               ::scan,currp);
    __n_00 = (__node_ptr)
             (((long)checker.
                     super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                     .
                     super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                     .
                     super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                     .stack.flexible.
                     super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>::Task>_>
                     ._M_impl.super__Vector_impl_data._M_start -
               (long)checker.
                     super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                     .
                     super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                     .
                     super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                     .stack.fixed._M_elems[9].currp >> 4) +
             (long)checker.
                   super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                   .
                   super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                   .
                   super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                   .replacep);
    if (__n_00 != (__node_ptr)0x0) {
      do {
        if ((pointer)checker.
                     super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                     .
                     super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                     .
                     super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                     .stack.fixed._M_elems[9].currp ==
            checker.
            super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
            .
            super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
            .
            super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
            .stack.flexible.
            super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>::Task>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          if (checker.
              super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
              .
              super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
              .
              super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
              .replacep == (Expression **)0x0) {
            pcVar11 = 
            "T &wasm::SmallVector<wasm::Walker<wasm::(anonymous namespace)::Checker, wasm::UnifiedExpressionVisitor<wasm::(anonymous namespace)::Checker>>::Task, 10>::back() [T = wasm::Walker<wasm::(anonymous namespace)::Checker, wasm::UnifiedExpressionVisitor<wasm::(anonymous namespace)::Checker>>::Task, N = 10]"
            ;
            goto LAB_00935aef;
          }
          ppEVar13 = checker.
                     super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                     .
                     super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                     .
                     super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                     .stack.fixed._M_elems
                     [(long)checker.
                            super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                            .
                            super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                            .
                            super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                            .replacep + -2].currp;
          scanner._488_8_ =
               *(undefined8 *)
                ((long)(&checker.
                         super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                         .
                         super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                         .
                         super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                         .stack + -1) + 0xb8 +
                (long)checker.
                      super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                      .
                      super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                      .
                      super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                      .replacep * 0x10);
          checker.
          super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
          .
          super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
          .
          super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
          .replacep = (Expression **)
                      ((long)checker.
                             super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                             .
                             super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                             .
                             super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                             .replacep + -1);
        }
        else {
          ppEVar13 = (Expression **)
                     checker.
                     super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                     .
                     super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                     .
                     super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                     .stack.flexible.
                     super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>::Task>_>
                     ._M_impl.super__Vector_impl_data._M_start[-1].func;
          scanner._488_8_ =
               checker.
               super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
               .
               super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
               .
               super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
               .stack.flexible.
               super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>::Task>_>
               ._M_impl.super__Vector_impl_data._M_start[-1].currp;
          checker.
          super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
          .
          super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
          .
          super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
          .stack.flexible.
          super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>::Task>_>
          ._M_impl.super__Vector_impl_data._M_start =
               checker.
               super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
               .
               super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
               .
               super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
               .stack.flexible.
               super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>::Task>_>
               ._M_impl.super__Vector_impl_data._M_start + -1;
        }
        if (*(Expression **)scanner._488_8_ == (Expression *)0x0) {
          pcVar11 = 
          "void wasm::Walker<wasm::(anonymous namespace)::Checker, wasm::UnifiedExpressionVisitor<wasm::(anonymous namespace)::Checker>>::walk(Expression *&) [SubType = wasm::(anonymous namespace)::Checker, VisitorType = wasm::UnifiedExpressionVisitor<wasm::(anonymous namespace)::Checker>]"
          ;
          goto LAB_00935aa2;
        }
        puStack_510 = (undefined1 *)0x9355c0;
        (*(code *)ppEVar13)((Checker *)&scanner.connectAdjacentBlocks,(Expression **)scanner._488_8_
                           );
        __n_00 = (__node_ptr)
                 (((long)checker.
                         super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                         .
                         super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                         .
                         super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                         .stack.flexible.
                         super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>::Task>_>
                         ._M_impl.super__Vector_impl_data._M_start -
                   (long)checker.
                         super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                         .
                         super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                         .
                         super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                         .stack.fixed._M_elems[9].currp >> 4) +
                 (long)checker.
                       super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                       .
                       super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                       .
                       super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                       .replacep);
      } while (__n_00 != (__node_ptr)0x0);
    }
    pp_Var7 = requestInfos.
              super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
              ._M_h._M_buckets;
    if (checker.activeOriginals._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
      puStack_510 = (undefined1 *)0x935b18;
      __assert_fail("activeOriginals.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/LocalCSE.cpp"
                    ,0x219,"void wasm::(anonymous namespace)::Checker::visitFunction(Function *)");
    }
    checker.
    super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .
    super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .stack.flexible.
    super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    checker.
    super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .
    super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .stack.flexible.
    super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
    checker.
    super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .
    super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .currFunction._0_1_ = 0;
    checker.
    super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .
    super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
    .currFunction._1_7_ = 0;
    this_00 = (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>,_false>_>_>
               *)checker.activeOriginals._M_h._M_bucket_count;
    if (requestInfos.
        super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
        ._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
      __s = &applier.requestInfos.
             super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
             ._M_h._M_rehash_policy._M_next_resize;
      checker.connectAdjacentBlocks = false;
      checker._297_7_ = 0;
      applier.
      super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .replacep = (Expression **)0x0;
      applier.
      super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .stack.fixed._M_elems[9].currp = (Expression **)0x0;
      applier.
      super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .stack.flexible.
      super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      applier.
      super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .stack.flexible.
      super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      applier.
      super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .stack.flexible.
      super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
      applier.
      super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .stack.flexible.
      super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
      applier.
      super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .currFunction._0_1_ = 0;
      applier.
      super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .currFunction._1_7_ = 0;
      applier.
      super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .currModule._0_1_ = 0;
      applier.
      super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .connectAdjacentBlocks = false;
      applier.
      super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      ._217_7_ = 0;
      applier.requestInfos.
      super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
      ._M_h._M_buckets =
           requestInfos.
           super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
           ._M_h._M_buckets;
      applier.requestInfos.
      super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
      ._M_h._M_bucket_count = 0;
      applier.requestInfos.
      super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
      ._M_h._M_before_begin =
           requestInfos.
           super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
           ._M_h._M_before_begin;
      applier.requestInfos.
      super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
      ._M_h._M_element_count =
           CONCAT44(requestInfos.
                    super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
                    ._M_h._M_element_count._4_4_,
                    (undefined4)
                    requestInfos.
                    super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
                    ._M_h._M_element_count);
      applier.requestInfos.
      super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
      ._M_h._M_rehash_policy._M_max_load_factor =
           requestInfos.
           super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
           ._M_h._M_rehash_policy._M_max_load_factor;
      applier.requestInfos.
      super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
      ._M_h._M_rehash_policy._4_4_ =
           requestInfos.
           super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
           ._M_h._M_rehash_policy._4_4_;
      applier.requestInfos.
      super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
      ._M_h._M_rehash_policy._M_next_resize = 0;
      if (requestInfos.
          super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
          ._M_h._M_buckets != (__buckets_ptr)0x1) {
        puStack_510 = (undefined1 *)0x93566e;
        __s = (size_t *)
              __gnu_cxx::new_allocator<std::__detail::_Hash_node_base_*>::allocate
                        (local_31,(size_type)
                                  requestInfos.
                                  super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
                                  ._M_h._M_buckets,(void *)0x0);
        puStack_510 = (undefined1 *)0x935682;
        memset(__s,0,(long)pp_Var7 << 3);
      }
      sVar8 = requestInfos.
              super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
              ._M_h._M_bucket_count;
      applier.
      super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      ._216_8_ = __s;
      if (requestInfos.
          super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
          ._M_h._M_bucket_count != 0) {
        puStack_510 = (undefined1 *)0x9356a4;
        applier.requestInfos.
        super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
        ._M_h._M_bucket_count = (size_type)operator_new(0x20);
        *(undefined8 *)
         applier.requestInfos.
         super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
         ._M_h._M_bucket_count = 0;
        *(undefined8 *)
         (applier.requestInfos.
          super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
          ._M_h._M_bucket_count + 0x18) = *(undefined8 *)(sVar8 + 0x18);
        uVar6 = *(undefined8 *)(sVar8 + 0x10);
        *(undefined8 *)
         (applier.requestInfos.
          super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
          ._M_h._M_bucket_count + 8) = *(undefined8 *)(sVar8 + 8);
        *(undefined8 *)
         (applier.requestInfos.
          super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
          ._M_h._M_bucket_count + 0x10) = uVar6;
        *(size_type **)
         (applier.
          super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
          ._216_8_ +
         (*(ulong *)(applier.requestInfos.
                     super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
                     ._M_h._M_bucket_count + 8) %
         (ulong)applier.requestInfos.
                super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
                ._M_h._M_buckets) * 8) =
             &applier.requestInfos.
              super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
              ._M_h._M_bucket_count;
        puVar17 = (undefined8 *)
                  applier.requestInfos.
                  super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
                  ._M_h._M_bucket_count;
        for (puVar15 = *(undefined8 **)sVar8; puVar15 != (undefined8 *)0x0;
            puVar15 = (undefined8 *)*puVar15) {
          puStack_510 = (undefined1 *)0x9356f7;
          puVar10 = (undefined8 *)operator_new(0x20);
          *puVar10 = 0;
          uVar6 = puVar15[2];
          puVar10[1] = puVar15[1];
          puVar10[2] = uVar6;
          puVar10[3] = puVar15[3];
          *puVar17 = puVar10;
          if (*(long *)(applier.
                        super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                        ._216_8_ +
                       ((ulong)puVar10[1] %
                       (ulong)applier.requestInfos.
                              super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
                              ._M_h._M_buckets) * 8) == 0) {
            *(undefined8 **)
             (applier.
              super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
              ._216_8_ +
             ((ulong)puVar10[1] %
             (ulong)applier.requestInfos.
                    super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
                    ._M_h._M_buckets) * 8) = puVar17;
          }
          puVar17 = puVar10;
        }
      }
      applier.requestInfos.
      super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
      ._M_h._M_single_bucket =
           (__node_base_ptr)&applier.originalLocalMap._M_h._M_rehash_policy._M_next_resize;
      applier.originalLocalMap._M_h._M_buckets = (__buckets_ptr)0x1;
      applier.originalLocalMap._M_h._M_bucket_count = 0;
      applier.originalLocalMap._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      applier.originalLocalMap._M_h._M_element_count._0_4_ = 0x3f800000;
      applier.originalLocalMap._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      applier.originalLocalMap._M_h._M_rehash_policy._4_4_ = 0;
      applier.originalLocalMap._M_h._M_rehash_policy._M_next_resize = 0;
      applier.originalLocalMap._M_h._M_single_bucket._0_1_ = 1;
      pMVar3 = (this->
               super_WalkerPass<wasm::PostWalker<wasm::LocalCSE,_wasm::Visitor<wasm::LocalCSE,_void>_>_>
               ).super_PostWalker<wasm::LocalCSE,_wasm::Visitor<wasm::LocalCSE,_void>_>.
               super_Walker<wasm::LocalCSE,_wasm::Visitor<wasm::LocalCSE,_void>_>.currModule;
      applier.
      super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .currFunction._0_1_ = SUB81(pMVar3,0);
      applier.
      super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .currFunction._1_7_ = (undefined7)((ulong)pMVar3 >> 8);
      applier.
      super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .stack.flexible.
      super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ =
           SUB81(requestInfos.
                 super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
                 ._M_h._M_single_bucket,0);
      applier.
      super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .stack.flexible.
      super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ =
           (undefined7)
           ((ulong)requestInfos.
                   super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
                   ._M_h._M_single_bucket >> 8);
      if (((long)applier.
                 super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                 .
                 super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                 .
                 super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                 .stack.flexible.
                 super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task>_>
                 ._M_impl.super__Vector_impl_data._M_start -
           (long)applier.
                 super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                 .
                 super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                 .
                 super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                 .stack.fixed._M_elems[9].currp >> 4) +
          (long)applier.
                super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                .
                super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                .replacep != 0) {
        puStack_510 = &LAB_00935b37;
        __assert_fail("stack.size() == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                      ,0x12d,
                      "void wasm::Walker<wasm::(anonymous namespace)::Applier, wasm::UnifiedExpressionVisitor<wasm::(anonymous namespace)::Applier>>::walk(Expression *&) [SubType = wasm::(anonymous namespace)::Applier, VisitorType = wasm::UnifiedExpressionVisitor<wasm::(anonymous namespace)::Applier>]"
                     );
      }
      puStack_510 = (undefined1 *)0x9357b2;
      Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      ::pushTask((Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                  *)&checker.connectAdjacentBlocks,
                 LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                 ::scan,currp);
      if (((long)applier.
                 super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                 .
                 super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                 .
                 super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                 .stack.flexible.
                 super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task>_>
                 ._M_impl.super__Vector_impl_data._M_start -
           (long)applier.
                 super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                 .
                 super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                 .
                 super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                 .stack.fixed._M_elems[9].currp >> 4) +
          (long)applier.
                super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                .
                super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                .replacep != 0) {
        do {
          if ((pointer)applier.
                       super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                       .
                       super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                       .
                       super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                       .stack.fixed._M_elems[9].currp ==
              applier.
              super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
              .
              super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
              .
              super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
              .stack.flexible.
              super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            if (applier.
                super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                .
                super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                .replacep == (Expression **)0x0) {
              pcVar11 = 
              "T &wasm::SmallVector<wasm::Walker<wasm::(anonymous namespace)::Applier, wasm::UnifiedExpressionVisitor<wasm::(anonymous namespace)::Applier>>::Task, 10>::back() [T = wasm::Walker<wasm::(anonymous namespace)::Applier, wasm::UnifiedExpressionVisitor<wasm::(anonymous namespace)::Applier>>::Task, N = 10]"
              ;
LAB_00935aef:
              puStack_510 = (undefined1 *)0x935af9;
              __assert_fail("usedFixed > 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_vector.h"
                            ,0x7e,pcVar11);
            }
            p_Var14 = *(TaskFunc *)
                       ((long)(&applier.
                                super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                                .
                                super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                                .
                                super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                                .stack.fixed + -1) + 0x88 +
                       (long)applier.
                             super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                             .
                             super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                             .
                             super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                             .replacep * 0x10);
            checker._296_8_ =
                 *(undefined8 *)
                  ((long)(&applier.
                           super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                           .
                           super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                           .
                           super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                           .stack.fixed + -1) + 0x90 +
                  (long)applier.
                        super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                        .
                        super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                        .
                        super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                        .replacep * 0x10);
            applier.
            super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
            .
            super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
            .
            super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
            .replacep = (Expression **)
                        ((long)applier.
                               super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                               .
                               super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                               .
                               super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                               .replacep + -1);
          }
          else {
            p_Var14 = applier.
                      super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                      .
                      super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                      .
                      super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                      .stack.flexible.
                      super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task>_>
                      ._M_impl.super__Vector_impl_data._M_start[-1].func;
            checker._296_8_ =
                 applier.
                 super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                 .
                 super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                 .
                 super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                 .stack.flexible.
                 super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task>_>
                 ._M_impl.super__Vector_impl_data._M_start[-1].currp;
            applier.
            super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
            .
            super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
            .
            super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
            .stack.flexible.
            super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 applier.
                 super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                 .
                 super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                 .
                 super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                 .stack.flexible.
                 super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task>_>
                 ._M_impl.super__Vector_impl_data._M_start + -1;
          }
          if (*(Expression **)checker._296_8_ == (Expression *)0x0) {
            pcVar11 = 
            "void wasm::Walker<wasm::(anonymous namespace)::Applier, wasm::UnifiedExpressionVisitor<wasm::(anonymous namespace)::Applier>>::walk(Expression *&) [SubType = wasm::(anonymous namespace)::Applier, VisitorType = wasm::UnifiedExpressionVisitor<wasm::(anonymous namespace)::Applier>]"
            ;
LAB_00935aa2:
            puStack_510 = (undefined1 *)0x935aac;
            __assert_fail("*task.currp",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                          ,0x132,pcVar11);
          }
          puStack_510 = (undefined1 *)0x93583b;
          (*p_Var14)((Applier *)&checker.connectAdjacentBlocks,(Expression **)checker._296_8_);
        } while (((long)applier.
                        super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                        .
                        super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                        .
                        super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                        .stack.flexible.
                        super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task>_>
                        ._M_impl.super__Vector_impl_data._M_start -
                  (long)applier.
                        super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                        .
                        super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                        .
                        super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                        .stack.fixed._M_elems[9].currp >> 4) +
                 (long)applier.
                       super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                       .
                       super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                       .
                       super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                       .replacep != 0);
      }
      applier.
      super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .stack.flexible.
      super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
      applier.
      super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .stack.flexible.
      super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
      applier.
      super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .currFunction._0_1_ = 0;
      applier.
      super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .
      super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      .currFunction._1_7_ = 0;
      puStack_510 = (undefined1 *)0x935875;
      std::
      _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_unsigned_int>,_std::allocator<std::pair<wasm::Expression_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_unsigned_int>,_std::allocator<std::pair<wasm::Expression_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)&applier.requestInfos.
                        super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
                        ._M_h._M_single_bucket);
      puVar15 = (undefined8 *)
                applier.requestInfos.
                super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
                ._M_h._M_bucket_count;
      while (puVar15 != (undefined8 *)0x0) {
        puVar17 = (undefined8 *)*puVar15;
        puStack_510 = (undefined1 *)0x93588b;
        operator_delete(puVar15,0x20);
        puVar15 = puVar17;
      }
      __n_00 = (__node_ptr)0x0;
      puStack_510 = (undefined1 *)0x9358ac;
      memset((void *)applier.
                     super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                     ._216_8_,0,
             (long)applier.requestInfos.
                   super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
                   ._M_h._M_buckets << 3);
      applier.requestInfos.
      super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
      ._M_h._M_bucket_count = 0;
      applier.requestInfos.
      super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
      ._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      if (&applier.requestInfos.
           super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
           ._M_h._M_rehash_policy._M_next_resize !=
          (size_t *)
          applier.
          super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
          ._216_8_) {
        __n_00 = (__node_ptr)
                 ((long)applier.requestInfos.
                        super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
                        ._M_h._M_buckets << 3);
        puStack_510 = (undefined1 *)0x9358dc;
        operator_delete((void *)applier.
                                super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                                ._216_8_,(ulong)__n_00);
      }
      this_00 = (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>,_false>_>_>
                 *)checker.activeOriginals._M_h._M_bucket_count;
      if (applier.
          super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
          .
          super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
          .
          super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
          .stack.fixed._M_elems[9].currp != (Expression **)0x0) {
        __n_00 = (__node_ptr)
                 ((long)applier.
                        super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                        .
                        super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                        .
                        super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                        .stack.flexible.
                        super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>::Task>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)applier.
                       super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                       .
                       super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                       .
                       super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                       .stack.fixed._M_elems[9].currp);
        puStack_510 = (undefined1 *)0x9358f7;
        operator_delete(applier.
                        super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                        .
                        super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                        .
                        super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                        .stack.fixed._M_elems[9].currp,(ulong)__n_00);
        this_00 = (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>,_false>_>_>
                   *)checker.activeOriginals._M_h._M_bucket_count;
      }
    }
    while (this_00 !=
           (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>,_false>_>_>
            *)0x0) {
      p_Var4 = *(_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>,_false>_>_>
                 **)this_00;
      puStack_510 = (undefined1 *)0x93590e;
      std::__detail::
      _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>,_false>_>_>
      ::_M_deallocate_node(this_00,__n_00);
      this_00 = p_Var4;
    }
    __n = (__node_ptr)0x0;
    puStack_510 = (undefined1 *)0x93592f;
    memset(checker.requestInfos,0,(long)checker.activeOriginals._M_h._M_buckets << 3);
    checker.activeOriginals._M_h._M_bucket_count = 0;
    checker.activeOriginals._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    if ((RequestInfoMap *)psVar2 != checker.requestInfos) {
      __n = (__node_ptr)((long)checker.activeOriginals._M_h._M_buckets << 3);
      puStack_510 = (undefined1 *)0x935951;
      operator_delete(checker.requestInfos,(ulong)__n);
    }
    if (checker.
        super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
        .
        super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
        .
        super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
        .stack.fixed._M_elems[9].currp != (Expression **)0x0) {
      __n = (__node_ptr)
            ((long)checker.
                   super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                   .
                   super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                   .
                   super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                   .stack.flexible.
                   super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>::Task>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
            (long)checker.
                  super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                  .
                  super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                  .
                  super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                  .stack.fixed._M_elems[9].currp);
      puStack_510 = (undefined1 *)0x93596c;
      operator_delete(checker.
                      super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                      .
                      super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                      .
                      super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
                      .stack.fixed._M_elems[9].currp,(ulong)__n);
    }
  }
  this_01 = (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::(anonymous_namespace)::HashedExpression,_wasm::SmallVector<wasm::Expression_*,_1UL>_>,_true>_>_>
             *)scanner.activeExprs._M_h._M_bucket_count;
  if (scanner.activeIncrementalInfo.fixed._M_elems[9]._8_8_ != 0) {
    __n = (__node_ptr)
          ((long)scanner.activeIncrementalInfo.flexible.
                 super__Vector_base<std::pair<unsigned_long,_bool>,_std::allocator<std::pair<unsigned_long,_bool>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          scanner.activeIncrementalInfo.fixed._M_elems[9]._8_8_);
    puStack_510 = (undefined1 *)0x935987;
    operator_delete((void *)scanner.activeIncrementalInfo.fixed._M_elems[9]._8_8_,(ulong)__n);
    this_01 = (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::(anonymous_namespace)::HashedExpression,_wasm::SmallVector<wasm::Expression_*,_1UL>_>,_true>_>_>
               *)scanner.activeExprs._M_h._M_bucket_count;
  }
  while (this_01 !=
         (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::(anonymous_namespace)::HashedExpression,_wasm::SmallVector<wasm::Expression_*,_1UL>_>,_true>_>_>
          *)0x0) {
    p_Var5 = *(_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::(anonymous_namespace)::HashedExpression,_wasm::SmallVector<wasm::Expression_*,_1UL>_>,_true>_>_>
               **)this_01;
    puStack_510 = (undefined1 *)0x93599b;
    std::__detail::
    _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::(anonymous_namespace)::HashedExpression,_wasm::SmallVector<wasm::Expression_*,_1UL>_>,_true>_>_>
    ::_M_deallocate_node(this_01,__n);
    this_01 = p_Var5;
  }
  puStack_510 = (undefined1 *)0x9359bc;
  memset(scanner.requestInfos,0,(long)scanner.activeExprs._M_h._M_buckets << 3);
  scanner.activeExprs._M_h._M_bucket_count = 0;
  scanner.activeExprs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  if ((RequestInfoMap *)psVar1 != scanner.requestInfos) {
    puStack_510 = (undefined1 *)0x9359e0;
    operator_delete(scanner.requestInfos,(long)scanner.activeExprs._M_h._M_buckets << 3);
  }
  puVar15 = (undefined8 *)
            requestInfos.
            super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
            ._M_h._M_bucket_count;
  if (scanner.
      super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
      .
      super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
      .
      super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
      .stack.fixed._M_elems[9].currp != (Expression **)0x0) {
    puStack_510 = (undefined1 *)0x9359fb;
    operator_delete(scanner.
                    super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                    .
                    super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                    .
                    super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                    .stack.fixed._M_elems[9].currp,
                    (long)scanner.
                          super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                          .
                          super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                          .
                          super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                          .stack.flexible.
                          super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>::Task>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)scanner.
                          super_LinearExecutionWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                          .
                          super_PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                          .
                          super_Walker<wasm::(anonymous_namespace)::Scanner,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Scanner,_void>_>
                          .stack.fixed._M_elems[9].currp);
    puVar15 = (undefined8 *)
              requestInfos.
              super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
              ._M_h._M_bucket_count;
  }
  while (puVar15 != (undefined8 *)0x0) {
    puVar17 = (undefined8 *)*puVar15;
    puStack_510 = (undefined1 *)0x935a11;
    operator_delete(puVar15,0x20);
    puVar15 = puVar17;
  }
  puStack_510 = (undefined1 *)0x935a2c;
  memset(local_88,0,
         (long)requestInfos.
               super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
               ._M_h._M_buckets << 3);
  requestInfos.
  super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
  ._M_h._M_bucket_count = 0;
  requestInfos.
  super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
  ._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  if (&requestInfos.
       super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
       ._M_h._M_rehash_policy._M_next_resize != local_88) {
    puStack_510 = (undefined1 *)0x935a4d;
    operator_delete(local_88,(long)requestInfos.
                                   super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
                                   ._M_h._M_buckets << 3);
  }
  return;
}

Assistant:

void doWalkFunction(Function* func) {
    auto& options = getPassOptions();

    RequestInfoMap requestInfos;

    Scanner scanner(options, requestInfos);
    scanner.walkFunctionInModule(func, getModule());
    if (requestInfos.empty()) {
      // We did not find any repeated expressions at all.
      return;
    }

    Checker checker(options, requestInfos);
    checker.walkFunctionInModule(func, getModule());
    if (requestInfos.empty()) {
      // No repeated expressions remain after checking for effects.
      return;
    }

    Applier applier(requestInfos);
    applier.walkFunctionInModule(func, getModule());
  }